

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

void __thiscall xray_re::xr_ini_writer::xr_ini_writer(xr_ini_writer *this)

{
  xr_memory_writer::xr_memory_writer(&this->super_xr_memory_writer);
  (this->super_xr_memory_writer).super_xr_writer._vptr_xr_writer =
       (_func_int **)&PTR__xr_ini_writer_0023a4e8;
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&this->m_section_stack);
  return;
}

Assistant:

xr_ini_writer::xr_ini_writer() : m_section_stack() {}